

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>>
  *this;
  ostream *poVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> line;
  Cmd cmd;
  undefined1 local_1d0 [32];
  bool local_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  undefined1 local_128 [120];
  function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  local_b0 [5];
  
  _Var1._M_p = local_1d0 + 0x10;
  local_1d0._0_8_ = _Var1._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"history.txt","");
  Cmd::Cmd((Cmd *)local_128,(string *)local_1d0,_stdin,_stdout);
  if ((pointer)local_1d0._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  local_128[0x20] = true;
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  local_130 = std::
              _Function_handler<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:13:23)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:13:23)>
              ::_M_manager;
  std::function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  operator=(local_b0,(function<std::optional<Cmd::Hint>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)&local_148);
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,__destroy_functor);
  }
  local_1d0._0_8_ = _Var1._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"test","");
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:24:30)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:24:30)>
              ::_M_manager;
  this = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>>
          *)(local_128 + 0x48);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>>
  ::
  _M_emplace_unique<std::__cxx11::string_const&,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>&>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
             (function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_168);
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,__destroy_functor);
  }
  if ((pointer)local_1d0._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  local_1d0._0_8_ = _Var1._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"clear","");
  local_188._M_unused._M_object = (void *)0x0;
  local_188._8_8_ = 0;
  local_170 = std::
              _Function_handler<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:33:31)>
              ::_M_invoke;
  local_178 = std::
              _Function_handler<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:33:31)>
              ::_M_manager;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>>
  ::
  _M_emplace_unique<std::__cxx11::string_const&,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>&>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
             (function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_188);
  if (local_178 != (code *)0x0) {
    (*local_178)(&local_188,&local_188,__destroy_functor);
  }
  if ((pointer)local_1d0._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  local_1d0._0_8_ = _Var1._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"exit","");
  local_1a8._M_unused._M_object = (void *)0x0;
  local_1a8._8_8_ = 0;
  local_190 = std::
              _Function_handler<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:39:30)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/eteran[P]cpp-cmd/main.cpp:39:30)>
              ::_M_manager;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>>>>
  ::
  _M_emplace_unique<std::__cxx11::string_const&,std::function<bool(Cmd*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>&>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
             (function<bool_(Cmd_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_1a8);
  if (local_198 != (code *)0x0) {
    (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
  }
  if ((pointer)local_1d0._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace((ulong)local_128,0,(char *)local_128._8_8_,0x1060c8);
  Cmd::nextLine_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1d0,(Cmd *)local_128,true);
  if (local_1b0 == true) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1d0._0_8_,local_1d0._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if (local_1b0 == true) {
    local_1b0 = false;
    if ((pointer)local_1d0._0_8_ != _Var1._M_p) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
  }
  std::__cxx11::string::_M_replace((ulong)local_128,0,(char *)local_128._8_8_,0x1060d4);
  Cmd::cmdLoop((Cmd *)local_128);
  Cmd::~Cmd((Cmd *)local_128);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

	(void)argc;
	(void)argv;

	Cmd cmd("history.txt");
	cmd.multiline_mode = true;

	cmd.setHintsCallback([](std::string_view buf) -> std::optional<Cmd::Hint> {
		if (buf == "git remote add") {
			Cmd::Hint r;
			r.hint_string = " <name> <url>";
			r.color = 90;
			r.bold = false;
			return r;
		}
		return {};
	});

	cmd.registerCommand("test", [](Cmd *cmd, const std::vector<std::string> &argv) {
		(void)cmd;
		printf("Hello World!\n");
		for(size_t i = 1; i < argv.size(); ++i) {
			printf("\t%s\n", argv[i].c_str());
		}
		return false;
	});

	cmd.registerCommand("clear", [](Cmd *cmd, const std::vector<std::string> &argv) {
		(void)argv;
		cmd->clearScreen();
		return false;
	});

	cmd.registerCommand("exit", [](Cmd *cmd, const std::vector<std::string> &argv) {
		(void)cmd;
		(void)argv;
		return true;
	});

	cmd.prompt = "(Password) ";

	if (auto line = cmd.nextLine(true)) {
		std::cout << *line << std::endl;
	}

	cmd.prompt = "(Cmd) ";

	cmd.cmdLoop();
}